

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O1

void __thiscall Fl_FLTK_File_Chooser::parse_filter(Fl_FLTK_File_Chooser *this)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  byte *__s;
  char cVar6;
  char wildcard [1024];
  char name [1024];
  char comp [2048];
  char local_1038 [1024];
  char local_c38 [1024];
  byte local_838 [2056];
  
  if (this->_parsedfilt != (char *)0x0) {
    operator_delete__(this->_parsedfilt);
  }
  this->_parsedfilt = (char *)0x0;
  this->_nfilters = 0;
  __s = (byte *)this->_filter;
  if (__s == (byte *)0x0) {
    return;
  }
  pcVar3 = strchr((char *)__s,9);
  cVar6 = (pcVar3 == (char *)0x0) * '\t' + 'n';
  memset(local_1038,0,0x400);
  memset(local_c38,0,0x400);
  do {
    bVar1 = *__s;
    if (bVar1 < 10) {
      if (bVar1 == 0) goto LAB_00187255;
      if ((bVar1 != 9) || (cVar2 = 'w', cVar6 != 'n')) goto LAB_0018721f;
    }
    else if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_00187255:
      if (local_1038[0] != '\0') {
        pcVar3 = "\t";
        if (this->_parsedfilt == (char *)0x0) {
          pcVar3 = "";
        }
        sprintf((char *)local_838,"%s%.511s(%.511s)",pcVar3,local_c38,local_1038);
        pcVar3 = this->_parsedfilt;
        if (pcVar3 == (char *)0x0) {
          __dest = strnew((char *)local_838);
        }
        else {
          sVar4 = strlen(pcVar3);
          sVar5 = strlen((char *)local_838);
          __dest = (char *)operator_new__(sVar4 + sVar5 + 1);
          strcpy(__dest,pcVar3);
          strcat(__dest,(char *)local_838);
          operator_delete__(pcVar3);
        }
        this->_parsedfilt = __dest;
        this->_nfilters = this->_nfilters + 1;
      }
      local_c38[0] = '\0';
      local_1038[0] = '\0';
      pcVar3 = strchr((char *)__s,9);
      if (*__s == 0) {
        return;
      }
      cVar2 = (pcVar3 == (char *)0x0) * '\t' + 'n';
    }
    else {
      if (bVar1 == 0x5c) {
        __s = __s + 1;
      }
LAB_0018721f:
      cVar2 = cVar6;
      if (cVar6 == 'w') {
        local_838[0] = *__s;
        pcVar3 = local_1038;
      }
      else {
        if (cVar6 != 'n') goto LAB_0018733f;
        local_838[0] = *__s;
        pcVar3 = local_c38;
      }
      local_838[1] = 0;
      strcat(pcVar3,(char *)local_838);
    }
LAB_0018733f:
    cVar6 = cVar2;
    __s = __s + 1;
  } while( true );
}

Assistant:

void Fl_FLTK_File_Chooser::parse_filter() {
  _parsedfilt = strfree(_parsedfilt);	// clear previous parsed filter (if any)
  _nfilters = 0;
  char *in = _filter;
  if ( !in ) return;

  int has_name = strchr(in, '\t') ? 1 : 0;

  char mode = has_name ? 'n' : 'w';	// parse mode: n=title, w=wildcard
  char wildcard[1024] = "";		// parsed wildcard
  char name[1024] = "";

  // Parse filter user specified
  for ( ; 1; in++ ) {
    /*** DEBUG
    printf("WORKING ON '%c': mode=<%c> name=<%s> wildcard=<%s>\n",
			*in, mode,     name,     wildcard);
    ***/

    switch (*in) {
      // FINISHED PARSING NAME?
      case '\t':
        if ( mode != 'n' ) goto regchar;
        mode = 'w';
        break; 
      // ESCAPE NEXT CHAR
      case '\\':
	++in;
	goto regchar; 
      // FINISHED PARSING ONE OF POSSIBLY SEVERAL FILTERS?
      case '\r':
      case '\n':
      case '\0':
	// APPEND NEW FILTER TO LIST
	if ( wildcard[0] ) {
	  // OUT: "name(wild)\tname(wild)"
	  char comp[2048];
	  sprintf(comp, "%s%.511s(%.511s)", ((_parsedfilt)?"\t":""),
					    name, wildcard);
	  _parsedfilt = strapp(_parsedfilt, comp);
	  _nfilters++;
	  //DEBUG printf("DEBUG: PARSED FILT NOW <%s>\n", _parsedfilt);
	}
	// RESET
	wildcard[0] = name[0] = '\0';
	mode = strchr(in, '\t') ? 'n' : 'w';
	// DONE?
	if ( *in == '\0' ) return;	// done
	else continue;			// not done yet, more filters

      // Parse all other chars
      default:				// handle all non-special chars
      regchar:				// handle regular char
	switch ( mode ) {
	  case 'n': chrcat(name, *in);     continue;
	  case 'w': chrcat(wildcard, *in); continue;
	}
	break;
    }
  }
  //NOTREACHED
}